

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberToString.h
# Opt level: O2

json_string *
NumberToString::_uitoa<unsigned_long>(json_string *__return_storage_ptr__,unsigned_long val)

{
  bool bVar1;
  char *pcVar2;
  allocator local_29;
  char num_str_result [22];
  
  pcVar2 = num_str_result + 0x15;
  num_str_result[0x15] = '\0';
  do {
    pcVar2[-1] = (byte)(val % 10) | 0x30;
    pcVar2 = pcVar2 + -1;
    bVar1 = 9 < val;
    val = val / 10;
  } while (bVar1);
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_29);
  return __return_storage_ptr__;
}

Assistant:

static json_string _uitoa(T val) json_nothrow {
		  #ifdef JSON_LESS_MEMORY
			 json_auto<json_char> s(getLenSize<sizeof(T)>::GETLEN);
		  #else
			 json_char num_str_result[getLenSize<sizeof(T)>::GETLEN];
		  #endif
		  num_str_result[getLenSize<sizeof(T)>::GETLEN - 1] = JSON_TEXT('\0'); //null terminator
		  json_char * runner = &num_str_result[getLenSize<sizeof(T)>::GETLEN - 2];

		  //create the string
		  START_MEM_SCOPE
			 unsigned long value = (unsigned long)val;
			 do {
				*runner-- = (json_char)(value % 10) + JSON_TEXT('0');
			 } while(value /= 10);
		  END_MEM_SCOPE

		  return json_string(runner + 1);
	   }